

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestViewClasses::initBufferObject
          (TextureViewTestViewClasses *this,GLenum texture_internalformat,GLenum view_internalformat
          )

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  deUint32 err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  uint view_texture_n_components;
  uint parent_texture_n_components;
  Functions *gl;
  GLenum view_internalformat_local;
  GLenum texture_internalformat_local;
  TextureViewTestViewClasses *this_local;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  uVar2 = TextureViewUtilities::getAmountOfComponentsForInternalformat(texture_internalformat);
  uVar3 = TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);
  this->m_bo_size =
       uVar2 * 4 * this->m_texture_height * this->m_texture_width +
       uVar3 * 4 * this->m_texture_height * this->m_texture_width;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x150))(0x8c8e,this->m_bo_size,0,0x88e4);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1a5f);
  this->m_view_data_offset = uVar2 * 4 * this->m_texture_height * this->m_texture_width;
  return;
}

Assistant:

void TextureViewTestViewClasses::initBufferObject(glw::GLenum texture_internalformat, glw::GLenum view_internalformat)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Calculate how much size we will need to read the XFBed data. Each sampled data
	 * will either end up stored in a vecX, ivecX or uvecX (where X stands for amount
	 * of components supported by considered internalformat), so we can assume it will
	 * take a sizeof(float) = sizeof(int) = sizeof(unsigned int)
	 */
	const unsigned int parent_texture_n_components =
		TextureViewUtilities::getAmountOfComponentsForInternalformat(texture_internalformat);
	const unsigned int view_texture_n_components =
		TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);

	/* Configure buffer object storage.
	 *
	 * NOTE: We do not care about the data type of the stored data, since sizes of the
	 *       types we're interested in (floats, ints and uints) match.
	 */
	DE_ASSERT(sizeof(float) == sizeof(unsigned int) && sizeof(float) == sizeof(int));

	m_bo_size =
		static_cast<unsigned int>(parent_texture_n_components * sizeof(float) * m_texture_height * m_texture_width +
								  view_texture_n_components * sizeof(float) * m_texture_height * m_texture_width);

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_size, DE_NULL, /* data */
				  GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* For XFB, we'll be outputting data sampled from both the texture and the view.
	 * Sampled texture data will go to the first half of the buffer, and the corresponding
	 * view data will go to the one half.
	 *
	 * Store the offset, from which the view's data will start so that we can correctly
	 * configure buffer object bindings in initProgramObject()
	 **/
	m_view_data_offset =
		static_cast<unsigned int>(parent_texture_n_components * sizeof(float) * m_texture_height * m_texture_width);
}